

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O1

ssize_t phosg::readlink(char *__path,char *__buf,size_t __len)

{
  size_type __n;
  cannot_stat_file *this;
  
  *(char **)__path = __path + 0x10;
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__path,0x400,'\0')
  ;
  __n = ::readlink(*(char **)__buf,*(char **)__path,*(size_t *)(__path + 8));
  if (-1 < (long)__n) {
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__path,__n,'\0')
    ;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__path);
    return (ssize_t)__path;
  }
  this = (cannot_stat_file *)__cxa_allocate_exception(0x20);
  cannot_stat_file::cannot_stat_file(this,(string *)__buf);
  __cxa_throw(this,&cannot_stat_file::typeinfo,cannot_stat_file::~cannot_stat_file);
}

Assistant:

string readlink(const string& filename) {
  string data(1024, 0);
  ssize_t length = ::readlink(filename.c_str(), data.data(), data.size());
  if (length < 0) {
    throw cannot_stat_file(filename);
  }
  data.resize(length);
  data.shrink_to_fit();
  return data;
}